

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O3

sexp_conflict
sexp_make_fifo_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
                   sexp_conflict arg1)

{
  long lVar1;
  __mode_t __mode;
  int iVar2;
  sexp_conflict psVar3;
  
  if ((((ulong)arg0 & 3) != 0) || (arg0->tag != 9)) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,9);
    return psVar3;
  }
  if (((ulong)arg1 & 1) == 0) {
    if ((((ulong)arg1 & 2) != 0) || (arg1->tag != 0xc)) {
      psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg1);
      return psVar3;
    }
    lVar1 = (long)&((arg0->value).type.cpl)->tag + (long)&((arg0->value).type.name)->tag;
    __mode = (int)(arg1->value).flonum_bits[0] * (int)(arg1->value).uvector.length;
  }
  else {
    lVar1 = (long)&((arg0->value).type.cpl)->tag + (long)&((arg0->value).type.name)->tag;
    __mode = (__mode_t)((long)arg1 >> 1);
  }
  iVar2 = mkfifo((char *)(lVar1 + 0x10),__mode);
  return (sexp_conflict)((ulong)(iVar2 == 0) << 8 | 0x3e);
}

Assistant:

sexp sexp_make_fifo_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int err = 0;
  sexp res;
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  err = mkfifo(sexp_string_data(arg0), sexp_sint_value(arg1));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}